

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator/=(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other)

{
  int *piVar1;
  pointer pvVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  size_type local_20;
  pointer local_18;
  
  if (this == other) {
    pvVar2 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    *pvVar2 = 1;
    uVar3 = (ulong)(this->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    if (uVar3 != 1) {
      memset(pvVar2 + 1,0,uVar3 * 4 - 4);
    }
  }
  else {
    uVar3 = (ulong)(other->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    bVar5 = uVar3 == 0;
    if ((!bVar5) &&
       (pvVar2 = (other->values).
                 super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                 elems, *pvVar2 == 0)) {
      lVar4 = 4;
      do {
        bVar5 = uVar3 << 2 == lVar4;
        if (bVar5) break;
        piVar1 = (int *)((long)pvVar2 + lVar4);
        lVar4 = lVar4 + 4;
      } while (*piVar1 == 0);
    }
    if (bVar5) {
      limits_helper_max<false>();
      uVar3 = (ulong)(this->values).
                     super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                     .elem_count;
      (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
           = local_20;
      pvVar2 = (this->values).
               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
               elems;
      (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
           local_18;
      if (uVar3 != 0) {
        operator_delete(pvVar2,uVar3 << 2);
      }
    }
    else {
      eval_divide_knuth(this,other,
                        (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0
                       );
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }